

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O1

RealType __thiscall OpenMD::ChargeField::getValue(ChargeField *this,StuntDouble *sd)

{
  AtomType *pAVar1;
  bool bVar2;
  RealType RVar3;
  FixedChargeAdapter fca;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter local_20;
  FluctuatingChargeAdapter local_18;
  
  pAVar1 = (AtomType *)sd[1]._vptr_StuntDouble;
  local_20.at_ = pAVar1;
  bVar2 = FixedChargeAdapter::isFixedCharge(&local_20);
  RVar3 = 0.0;
  if (bVar2) {
    RVar3 = FixedChargeAdapter::getCharge(&local_20);
  }
  local_18.at_ = pAVar1;
  bVar2 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_18);
  if (bVar2) {
    RVar3 = RVar3 + *(double *)
                     (*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).flucQPos.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start + sd->storage_) +
                     (long)sd->localIndex_ * 8);
  }
  return RVar3;
}

Assistant:

RealType ChargeField::getValue(StuntDouble* sd) {
    RealType charge = 0.0;
    Atom* atom      = static_cast<Atom*>(sd);

    AtomType* atomType = atom->getAtomType();

    FixedChargeAdapter fca = FixedChargeAdapter(atomType);
    if (fca.isFixedCharge()) { charge = fca.getCharge(); }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
    if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }
    return charge;
  }